

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void stable_sqrt_sort_common_sort(int **arr,int Len,int **extbuf,int *Tags)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int **ppiVar9;
  uint Len_00;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int **ppiVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int **ppiVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  int *piVar24;
  int iVar25;
  uint uVar26;
  int **ppiVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  undefined8 *puVar32;
  int *c;
  ulong uVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int **local_100;
  ulong local_e0;
  
  if (Len < 0x10) {
    if (1 < Len) {
      uVar12 = 1;
      uVar18 = 0;
      do {
        piVar24 = arr[uVar12];
        iVar15 = *piVar24;
        uVar8 = uVar18;
        do {
          piVar1 = arr[uVar8 & 0xffffffff];
          if (*piVar1 <= iVar15) break;
          arr[uVar8 & 0xffffffff] = piVar24;
          arr[uVar8 + 1] = piVar1;
          lVar28 = uVar8 + 1;
          uVar8 = uVar8 - 1;
        } while (1 < lVar28);
        uVar12 = uVar12 + 1;
        uVar18 = uVar18 + 1;
      } while (uVar12 != (uint)Len);
    }
  }
  else {
    uVar6 = 1;
    do {
      Len_00 = uVar6;
      uVar12 = (ulong)Len_00;
      uVar6 = Len_00 * 2;
    } while ((int)(Len_00 * Len_00) < Len);
    memcpy(extbuf,arr,uVar12 * 8);
    stable_sqrt_sort_common_sort(extbuf,Len_00,arr,Tags);
    uVar4 = Len - Len_00;
    if (1 < (int)uVar4) {
      uVar18 = 1;
      do {
        iVar21 = *arr[uVar12 + (uVar18 - 1)];
        iVar15 = *arr[uVar12 + uVar18];
        arr[uVar12 + (uVar18 - 3)] = arr[uVar12 + uVar18 + ((ulong)(iVar15 < iVar21) - 1)];
        arr[uVar12 + (uVar18 - 2)] = arr[uVar12 + (uVar18 - (iVar15 < iVar21))];
        uVar18 = uVar18 + 2;
      } while (uVar18 < uVar4);
    }
    lVar28 = (long)(int)uVar4;
    if ((uVar4 & 1) != 0) {
      arr[uVar12 + lVar28 + -3] = arr[uVar12 + lVar28 + -1];
    }
    ppiVar13 = arr + (uVar12 - 2);
    if (2 < (int)Len_00) {
      iVar15 = 2;
      do {
        iVar21 = iVar15 * 2;
        uVar5 = uVar4 + iVar15 * -2;
        lVar22 = 0;
        if (-1 < (int)uVar5) {
          lVar22 = 0;
          ppiVar9 = ppiVar13;
          do {
            stable_sqrt_sort_merge_left_with_x_buf(ppiVar9,iVar15,iVar15,-iVar15);
            lVar22 = lVar22 + iVar21;
            ppiVar9 = ppiVar9 + iVar21;
          } while (lVar22 <= (long)(ulong)uVar5);
        }
        iVar30 = (int)lVar22;
        iVar14 = (uVar4 - iVar30) - iVar15;
        if (iVar14 == 0 || (int)(uVar4 - iVar30) < iVar15) {
          if (iVar30 < (int)uVar4) {
            lVar22 = (long)iVar30;
            do {
              ppiVar13[lVar22 - iVar15] = ppiVar13[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar28 != lVar22);
          }
        }
        else {
          stable_sqrt_sort_merge_left_with_x_buf(ppiVar13 + iVar30,iVar15,iVar14,-iVar15);
        }
        ppiVar13 = ppiVar13 + -(long)iVar15;
        iVar15 = iVar21;
      } while (iVar21 < (int)Len_00);
    }
    iVar15 = (int)uVar4 % (int)uVar6;
    ppiVar9 = ppiVar13 + (int)(uVar4 - iVar15);
    lVar28 = (long)(int)Len_00;
    if (iVar15 - Len_00 == 0 || iVar15 < (int)Len_00) {
      memcpy(ppiVar9 + lVar28,ppiVar9,(long)iVar15 << 3);
    }
    else {
      stable_sqrt_sort_merge_right(ppiVar9,Len_00,iVar15 - Len_00,Len_00);
    }
    if (0 < (int)(uVar4 - iVar15)) {
      iVar21 = (Len - iVar15) - Len_00;
      iVar15 = (Len - iVar15) + Len_00 * -3;
      do {
        stable_sqrt_sort_merge_right(ppiVar13 + iVar15,Len_00,Len_00,Len_00);
        iVar21 = iVar21 + Len_00 * -2;
        iVar15 = iVar15 + Len_00 * -2;
      } while (0 < iVar21);
    }
    if ((int)uVar6 < Len) {
      auVar38 = _DAT_0011b280;
      uVar5 = Len_00;
      do {
        uVar29 = uVar6;
        iVar14 = uVar5 * 4;
        uVar6 = (int)uVar4 / iVar14;
        iVar15 = (int)uVar4 % iVar14;
        iVar21 = 0;
        if ((int)uVar29 < iVar15) {
          iVar21 = iVar15;
        }
        if ((int)uVar29 < iVar15) {
          iVar15 = 0;
        }
        if (-1 < (int)uVar6) {
          uVar18 = (ulong)uVar6;
          iVar30 = 0;
          local_e0 = 0;
          do {
            if ((iVar21 == 0) && (local_e0 == uVar18)) break;
            iVar20 = iVar14;
            if (local_e0 == uVar18) {
              iVar20 = iVar21;
            }
            uVar5 = iVar20 / (int)Len_00;
            uVar23 = (local_e0 == uVar18) + uVar5;
            if (-1 < (int)uVar23) {
              auVar35._4_4_ = 0;
              auVar35._0_4_ = uVar23;
              auVar35._8_4_ = uVar23;
              auVar35._12_4_ = 0;
              auVar35 = auVar35 ^ auVar38;
              uVar8 = 0;
              auVar36 = _DAT_0011b270;
              do {
                auVar37 = auVar36 ^ auVar38;
                if ((bool)(~(auVar35._4_4_ < auVar37._4_4_ ||
                            auVar35._0_4_ < auVar37._0_4_ && auVar37._4_4_ == auVar35._4_4_) & 1)) {
                  Tags[uVar8] = (int)uVar8;
                }
                if (auVar37._12_4_ <= auVar35._12_4_ &&
                    (auVar37._8_4_ <= auVar35._8_4_ || auVar37._12_4_ != auVar35._12_4_)) {
                  Tags[uVar8 + 1] = (int)uVar8 + 1;
                }
                uVar8 = uVar8 + 2;
                lVar22 = auVar36._8_8_;
                auVar36._0_8_ = auVar36._0_8_ + 2;
                auVar36._8_8_ = lVar22 + 2;
              } while ((uVar23 & 0x7ffffffe) + 2 != uVar8);
            }
            lVar22 = (long)iVar30;
            ppiVar13 = arr + uVar12 + (long)(iVar14 * (int)local_e0);
            if (1 < (int)uVar5) {
              ppiVar9 = arr + uVar12 + lVar22;
              ppiVar27 = arr + lVar28 + uVar12 + lVar22;
              uVar8 = 1;
              do {
                uVar31 = uVar8 - 1 & 0xffffffff;
                ppiVar19 = ppiVar27;
                uVar33 = uVar8;
                do {
                  if ((**ppiVar19 < *ppiVar13[(int)((int)uVar31 * Len_00)]) ||
                     ((*ppiVar13[(int)((int)uVar31 * Len_00)] == **ppiVar19 &&
                      (Tags[uVar33] < Tags[(int)uVar31])))) {
                    uVar31 = uVar33 & 0xffffffff;
                  }
                  uVar33 = uVar33 + 1;
                  ppiVar19 = ppiVar19 + lVar28;
                } while (uVar5 != uVar33);
                iVar20 = (int)uVar31;
                if (uVar8 - 1 != uVar31) {
                  lVar34 = 0;
                  do {
                    piVar24 = ppiVar9[lVar34];
                    ppiVar9[lVar34] = arr[uVar12 + lVar22 + (int)(iVar20 * Len_00) + lVar34];
                    arr[uVar12 + lVar22 + (int)(iVar20 * Len_00) + lVar34] = piVar24;
                    lVar34 = lVar34 + 1;
                  } while (Len_00 != (uint)lVar34);
                  iVar16 = Tags[uVar8 - 1];
                  Tags[uVar8 - 1] = Tags[iVar20];
                  Tags[iVar20] = iVar16;
                }
                uVar8 = uVar8 + 1;
                ppiVar27 = ppiVar27 + lVar28;
                ppiVar9 = ppiVar9 + lVar28;
              } while (uVar8 != uVar5);
            }
            bVar3 = true;
            if (local_e0 == uVar18) {
              iVar16 = iVar21 % (int)Len_00;
              uVar8 = 0;
              iVar20 = 0;
              if (iVar16 == 0) goto LAB_00109dd9;
              iVar20 = iVar16;
              if ((int)uVar5 < 1) {
                bVar3 = false;
                uVar8 = 0;
                goto LAB_00109dd9;
              }
              puVar32 = (undefined8 *)
                        ((long)arr + ((ulong)uVar5 - 1) * lVar28 * 8 + lVar22 * 8 + uVar12 * 8);
              uVar8 = 0;
              do {
                if (*(int *)*puVar32 <= *ppiVar13[(int)(uVar5 * Len_00)]) {
                  bVar3 = false;
                  goto LAB_00109dd9;
                }
                uVar8 = uVar8 + 1;
                puVar32 = puVar32 + -lVar28;
              } while (uVar5 != uVar8);
LAB_00109de7:
              iVar20 = uVar5 * Len_00;
LAB_0010a04d:
              stable_sqrt_sort_merge_left_with_x_buf(ppiVar13,iVar20,iVar16,-Len_00);
            }
            else {
              uVar8 = 0;
              iVar20 = 0;
LAB_00109dd9:
              iVar16 = iVar20;
              iVar20 = (int)uVar8;
              uVar23 = uVar5 - iVar20;
              if (uVar23 == 0) goto LAB_00109de7;
              uVar5 = (uint)((int)uVar29 / (int)Len_00 <= *Tags);
              uVar7 = Len_00;
              uVar11 = Len_00;
              if (1 < (int)uVar23) {
                ppiVar9 = arr + lVar28 + uVar12 + lVar22 + -1;
                local_100 = arr + (long)(int)-Len_00 + lVar28 + uVar12 + lVar22;
                uVar33 = 1;
                uVar8 = (ulong)Len_00;
                do {
                  uVar7 = (uint)uVar8;
                  ppiVar27 = ppiVar13 + (int)(uVar11 - uVar7);
                  if (uVar5 == (int)uVar29 / (int)Len_00 <= Tags[uVar33]) {
                    memcpy(ppiVar27 + -lVar28,ppiVar27,(long)(int)uVar7 << 3);
                    uVar8 = (ulong)Len_00;
                  }
                  else {
                    iVar10 = uVar7 + Len_00;
                    bVar2 = 0 < (int)uVar7;
                    uVar26 = 0;
                    uVar17 = uVar7;
                    if ((0 < (int)Len_00) && (uVar26 = 0, 0 < (int)uVar7)) {
                      ppiVar19 = local_100 + -(long)(int)uVar7;
                      uVar26 = 0;
                      do {
                        iVar25 = (*ppiVar27[uVar26] + (uVar5 - 1)) - *ppiVar27[uVar8];
                        piVar24 = ppiVar27[uVar26];
                        if (-1 < iVar25) {
                          piVar24 = ppiVar27[uVar8];
                        }
                        uVar26 = uVar26 - (iVar25 >> 0x1f);
                        uVar17 = (uint)(-1 < iVar25) + (int)uVar8;
                        uVar8 = (ulong)uVar17;
                        *ppiVar19 = piVar24;
                        bVar2 = (int)uVar26 < (int)uVar7;
                      } while (((int)uVar26 < (int)uVar7) &&
                              (ppiVar19 = ppiVar19 + 1, (int)uVar17 < iVar10));
                    }
                    if (bVar2) {
                      uVar8 = (ulong)(uVar7 - uVar26);
                      if (uVar7 - uVar26 != 0 && (int)uVar26 <= (int)uVar7) {
                        lVar22 = (long)(int)uVar7;
                        ppiVar27 = ppiVar9;
                        do {
                          lVar22 = lVar22 + -1;
                          ppiVar27[(long)iVar10 - (long)(int)uVar7] = *ppiVar27;
                          ppiVar27 = ppiVar27 + -1;
                        } while ((int)uVar26 < lVar22);
                      }
                    }
                    else {
                      uVar5 = 1 - uVar5;
                      uVar8 = (ulong)(iVar10 - uVar17);
                    }
                  }
                  uVar33 = uVar33 + 1;
                  uVar11 = uVar11 + Len_00;
                  local_100 = local_100 + lVar28;
                  ppiVar9 = ppiVar9 + lVar28;
                  uVar7 = (uint)uVar8;
                } while (uVar33 != uVar23);
              }
              uVar23 = uVar11 - uVar7;
              if (!bVar3) {
                if (uVar5 == 0) {
                  iVar20 = uVar7 + iVar20 * Len_00;
                }
                else {
                  memcpy(ppiVar13 + (int)uVar23 + -lVar28,ppiVar13 + (int)uVar23,
                         (long)(int)uVar7 << 3);
                  iVar20 = iVar20 * Len_00;
                  uVar23 = uVar11;
                }
                ppiVar13 = ppiVar13 + (int)uVar23;
                goto LAB_0010a04d;
              }
              memcpy(ppiVar13 + (int)uVar23 + -lVar28,ppiVar13 + (int)uVar23,(long)(int)uVar7 << 3);
            }
            local_e0 = local_e0 + 1;
            iVar30 = iVar30 + iVar14;
            auVar38 = _DAT_0011b280;
          } while (local_e0 != uVar6 + 1);
        }
        if (0 < (int)(uVar4 - iVar15)) {
          uVar18 = (ulong)(uVar4 - iVar15) + 1;
          do {
            arr[uVar12 + (uVar18 - 2)] = arr[(uVar12 + (uVar18 - 2)) - lVar28];
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
        uVar6 = uVar29 * 2;
        uVar5 = uVar29;
      } while ((int)(uVar29 * 2) < Len);
    }
    uVar6 = -Len_00;
    if ((int)Len_00 < 1) {
      uVar5 = 0;
    }
    else {
      ppiVar13 = arr + (long)(int)uVar6 + uVar12;
      iVar15 = 0;
      uVar5 = 0;
      do {
        if (uVar5 == uVar4) {
          piVar1 = extbuf[iVar15];
LAB_0010a146:
          piVar24 = piVar1;
          iVar15 = iVar15 + 1;
        }
        else {
          piVar24 = arr[uVar12 + (long)(int)uVar5];
          piVar1 = extbuf[iVar15];
          if (*extbuf[iVar15] <= *piVar24) goto LAB_0010a146;
          uVar5 = uVar5 + 1;
        }
        *ppiVar13 = piVar24;
        uVar6 = uVar6 + 1;
        ppiVar13 = ppiVar13 + 1;
      } while (iVar15 < (int)Len_00);
    }
    if ((int)uVar5 < (int)uVar4 && uVar6 != uVar5) {
      lVar22 = 0;
      do {
        arr[(long)(int)uVar6 + uVar12 + lVar22] = arr[(long)(int)uVar5 + uVar12 + lVar22];
        lVar22 = lVar22 + 1;
      } while (((long)Len - (long)(int)uVar5) - lVar28 != lVar22);
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                                  int *Tags) {
  int lblock, cbuf;

  if (Len < 16) {
    SQRT_SORT_SORT_INS(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  SORT_TYPE_CPY(extbuf, arr, lblock);
  SQRT_SORT_COMMON_SORT(extbuf, lblock, arr, Tags);
  SQRT_SORT_BUILD_BLOCKS(arr + lblock, Len - lblock, lblock);
  cbuf = lblock;

  while (Len > (cbuf *= 2)) {
    SQRT_SORT_COMBINE_BLOCKS(arr + lblock, Len - lblock, cbuf, lblock, Tags);
  }

  SQRT_SORT_MERGE_DOWN(arr + lblock, extbuf, Len - lblock, lblock);
}